

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Ptr_t * Acb_GenerateSignalNames2(Vec_Wec_t *vGates,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  int *piVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Str_t *p;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  uVar1 = vIns->nSize;
  uVar6 = (ulong)uVar1;
  uVar15 = vOuts->nSize;
  uVar2 = vGates->nSize;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar2 - 1) {
    uVar13 = uVar2;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar13;
  if (uVar13 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)(int)uVar13 << 3);
  }
  pVVar7->pArray = ppvVar8;
  pVVar7->nSize = uVar2;
  uVar17 = 0;
  memset(ppvVar8,0,(long)(int)uVar2 * 8);
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar9 = (char *)malloc(1000);
  p->pArray = pcVar9;
  if (0 < (int)uVar1) {
    ppvVar4 = vIns->pArray;
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar16 = (ulong)uVar2;
    }
    do {
      pcVar9 = (char *)ppvVar4[uVar17];
      if (pcVar9 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar9);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar9);
      }
      if (uVar16 == uVar17) goto LAB_0039c0a9;
      ppvVar8[uVar17] = pcVar11;
      uVar17 = uVar17 + 1;
    } while (uVar6 != uVar17);
  }
  iVar14 = uVar2 - (uVar1 + uVar15);
  if (0 < (int)uVar15) {
    ppvVar4 = vOuts->pArray;
    lVar18 = (long)(int)(uVar1 + iVar14) << 4;
    uVar17 = 0;
    do {
      lVar12 = (long)(int)(uVar1 + iVar14) + uVar17;
      if ((lVar12 < 0) || ((int)uVar2 <= lVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar3 = *(int *)((long)&vGates->pArray->nSize + lVar18);
      if (iVar3 < 1) {
LAB_0039c0c8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = *(int **)((long)&vGates->pArray->pArray + lVar18);
      if (*piVar5 != 0xb) {
        __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                      ,0x837,
                      "Vec_Ptr_t *Acb_GenerateSignalNames2(Vec_Wec_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      if (iVar3 == 1) goto LAB_0039c0c8;
      pcVar9 = (char *)ppvVar4[uVar17];
      uVar13 = piVar5[1];
      if (pcVar9 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar9);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar9);
      }
      if (((int)uVar13 < 0) || ((int)uVar2 <= (int)uVar13)) {
LAB_0039c0a9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      ppvVar8[uVar13] = pcVar11;
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar15 != uVar17);
  }
  if (0 < iVar14) {
    ppvVar8 = ppvVar8 + uVar6;
    uVar17 = 1;
    do {
      if (((int)uVar1 < 0) || ((int)uVar2 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*ppvVar8 == (void *)0x0) {
        Vec_StrPrintF(p,"ww%d",uVar17);
        uVar15 = p->nSize;
        uVar13 = p->nCap;
        if (uVar15 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(0x10);
            }
            else {
              pcVar9 = (char *)realloc(p->pArray,0x10);
            }
            sVar10 = 0x10;
          }
          else {
            sVar10 = (ulong)uVar13 * 2;
            if ((int)sVar10 <= (int)uVar13) goto LAB_0039c03a;
            if (p->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(sVar10);
            }
            else {
              pcVar9 = (char *)realloc(p->pArray,sVar10);
            }
          }
          p->pArray = pcVar9;
          p->nCap = (int)sVar10;
        }
LAB_0039c03a:
        uVar17 = (ulong)((int)uVar17 + 1);
        pcVar9 = p->pArray;
        p->nSize = uVar15 + 1;
        pcVar9[(int)uVar15] = '\0';
        p->nCap = 0;
        p->nSize = 0;
        p->pArray = (char *)0x0;
        *ppvVar8 = pcVar9;
      }
      ppvVar8 = ppvVar8 + 1;
      uVar15 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar15;
    } while ((int)uVar15 < (int)(iVar14 + uVar1));
  }
  if (p->pArray != (char *)0x0) {
    free(p->pArray);
    p->pArray = (char *)0x0;
  }
  free(p);
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames2( Vec_Wec_t * vGates, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts);
    int nNodes = Vec_WecSize(vGates) - nIns - nOuts;
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_WecSize(vGates) ); char * pName;
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, nWires = 1;
    // create input names
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(pName) );
    // create names for nodes driving outputs
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, nIns + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(pName) );
    }
    for ( i = nIns; i < nIns + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}